

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O2

void itrans_dct2_h4_w16_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int j;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  s16 tmp [64];
  s16 local_c0 [16];
  undefined1 auStack_a0 [152];
  
  auVar6._8_2_ = 0x20;
  auVar6._0_8_ = 0x20002000200020;
  auVar6._10_2_ = 0x20;
  auVar6._12_2_ = 0x20;
  auVar6._14_2_ = 0x20;
  auVar6._16_2_ = 0x20;
  auVar6._18_2_ = 0x20;
  auVar6._20_2_ = 0x20;
  auVar6._22_2_ = 0x20;
  auVar6._24_2_ = 0x20;
  auVar6._26_2_ = 0x20;
  auVar6._28_2_ = 0x20;
  auVar6._30_2_ = 0x20;
  auVar7._8_4_ = 0xffe00020;
  auVar7._0_8_ = 0xffe00020ffe00020;
  auVar7._12_4_ = 0xffe00020;
  auVar7._16_4_ = 0xffe00020;
  auVar7._20_4_ = 0xffe00020;
  auVar7._24_4_ = 0xffe00020;
  auVar7._28_4_ = 0xffe00020;
  auVar8._8_4_ = 0x11002a;
  auVar8._0_8_ = 0x11002a0011002a;
  auVar8._12_4_ = 0x11002a;
  auVar8._16_4_ = 0x11002a;
  auVar8._20_4_ = 0x11002a;
  auVar8._24_4_ = 0x11002a;
  auVar8._28_4_ = 0x11002a;
  auVar9._8_4_ = 0xffd60011;
  auVar9._0_8_ = 0xffd60011ffd60011;
  auVar9._12_4_ = 0xffd60011;
  auVar9._16_4_ = 0xffd60011;
  auVar9._20_4_ = 0xffd60011;
  auVar9._24_4_ = 0xffd60011;
  auVar9._28_4_ = 0xffd60011;
  auVar10._8_4_ = 0x10;
  auVar10._0_8_ = 0x1000000010;
  auVar10._12_4_ = 0x10;
  auVar10._16_4_ = 0x10;
  auVar10._20_4_ = 0x10;
  auVar10._24_4_ = 0x10;
  auVar10._28_4_ = 0x10;
  for (uVar5 = 0; uVar5 < 0x10; uVar5 = uVar5 + 8) {
    auVar3 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + uVar5),
                            *(undefined1 (*) [16])(src + uVar5 + 0x20));
    auVar1 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + uVar5),
                            *(undefined1 (*) [16])(src + uVar5 + 0x20));
    auVar4 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + uVar5 + 0x10),
                            *(undefined1 (*) [16])(src + uVar5 + 0x30));
    auVar2 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + uVar5 + 0x10),
                            *(undefined1 (*) [16])(src + uVar5 + 0x30));
    auVar13._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
    auVar13._16_16_ = ZEXT116(1) * auVar1;
    auVar11 = vpmaddwd_avx2(auVar13,auVar6);
    auVar13 = vpmaddwd_avx2(auVar13,auVar7);
    auVar12._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
    auVar12._16_16_ = ZEXT116(1) * auVar2;
    auVar15 = vpmaddwd_avx2(auVar12,auVar8);
    auVar12 = vpmaddwd_avx2(auVar12,auVar9);
    auVar14 = vpor_avx2(auVar11,auVar10);
    auVar11 = vpaddd_avx2(auVar14,auVar15);
    auVar16 = vpor_avx2(auVar13,auVar10);
    auVar13 = vpaddd_avx2(auVar16,auVar12);
    auVar12 = vpsubd_avx2(auVar16,auVar12);
    auVar15 = vpsubd_avx2(auVar14,auVar15);
    auVar14 = vpsrad_avx2(auVar11,5);
    auVar16 = vpsrad_avx2(auVar13,5);
    auVar11 = vpsrad_avx2(auVar12,5);
    auVar11 = vpackssdw_avx2(auVar14,auVar11);
    auVar13 = vpsrad_avx2(auVar15,5);
    auVar13 = vpackssdw_avx2(auVar16,auVar13);
    auVar15 = vpunpcklwd_avx2(auVar11,auVar13);
    auVar11 = vpunpckhwd_avx2(auVar11,auVar13);
    auVar13 = vpunpckldq_avx2(auVar15,auVar11);
    auVar11 = vpunpckhdq_avx2(auVar15,auVar11);
    auVar15._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar13._0_16_;
    auVar15._16_16_ = ZEXT116(0) * auVar13._16_16_ + ZEXT116(1) * auVar11._0_16_;
    *(undefined1 (*) [32])(local_c0 + uVar5 * 4) = auVar15;
    auVar11 = vperm2i128_avx2(auVar13,auVar11,0x31);
    *(undefined1 (*) [32])(auStack_a0 + uVar5 * 8) = auVar11;
  }
  dct2_butterfly_h16_sse(local_c0,4,dst,4,0x14 - bit_depth,bit_depth);
  return;
}

Assistant:

void itrans_dct2_h4_w16_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[4 * 16]);
    dct2_butterfly_h4_avx2(src, tmp, 16, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h16_sse(tmp, 4, dst, 4, 20 - bit_depth, bit_depth);
}